

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
::int_writer<int,fmt::v5::basic_format_specs<char>>::count_digits<1u>
          (int_writer<int,_fmt::v5::basic_format_specs<char>_> *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = 0;
  uVar3 = this->abs_value;
  do {
    iVar2 = iVar2 + 1;
    bVar1 = 1 < uVar3;
    uVar3 = uVar3 >> 1;
  } while (bVar1);
  return iVar2;
}

Assistant:

int count_digits() const {
      unsigned_type n = abs_value;
      int num_digits = 0;
      do {
        ++num_digits;
      } while ((n >>= BITS) != 0);
      return num_digits;
    }